

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBorderClampSamplingTexture<float,unsigned_char>::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  GLenum GVar1;
  TestError *pTVar2;
  ostream *poVar3;
  string local_220 [8];
  string outCommand;
  string outType;
  string samplerType;
  string coordType;
  stringstream result;
  ostream local_190;
  void *local_18;
  TextureBorderClampSamplingTexture<float,_unsigned_char> *this_local;
  
  local_18 = this;
  this_local = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(coordType.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(samplerType.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outType.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outCommand.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_220);
  GVar1 = TestConfiguration<float,_unsigned_char>::get_input_internal_format
                    ((TestConfiguration<float,_unsigned_char> *)((long)this + 0x2c8));
  if ((GVar1 != 0x8058) && (GVar1 != 0x81a5)) {
    if (GVar1 == 0x8235) {
      std::__cxx11::string::operator=((string *)(outType.field_2._M_local_buf + 8),"i");
      goto LAB_01558a2a;
    }
    if (GVar1 == 0x8236) {
      std::__cxx11::string::operator=((string *)(outType.field_2._M_local_buf + 8),"u");
      goto LAB_01558a2a;
    }
    if (((GVar1 != 0x8814) && (GVar1 != 0x8cac)) && (GVar1 != 0x9278)) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Not allowed internal format","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x318);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  std::__cxx11::string::operator=((string *)(outType.field_2._M_local_buf + 8),"");
LAB_01558a2a:
  GVar1 = TestConfiguration<float,_unsigned_char>::get_target
                    ((TestConfiguration<float,_unsigned_char> *)((long)this + 0x2c8));
  if (GVar1 == 0xde1) {
    std::__cxx11::string::operator=((string *)(samplerType.field_2._M_local_buf + 8),"vec2");
    std::__cxx11::string::operator+=((string *)(outType.field_2._M_local_buf + 8),"sampler2D");
  }
  else if (GVar1 == 0x806f) {
    std::__cxx11::string::operator=((string *)(samplerType.field_2._M_local_buf + 8),"vec3");
    std::__cxx11::string::operator+=((string *)(outType.field_2._M_local_buf + 8),"sampler3D");
  }
  else {
    if (GVar1 != 0x8c1a) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Not allowed texture target!","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x32e);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)(samplerType.field_2._M_local_buf + 8),"vec3");
    std::__cxx11::string::operator+=((string *)(outType.field_2._M_local_buf + 8),"sampler2DArray");
  }
  GVar1 = TestConfiguration<float,_unsigned_char>::get_output_internal_format
                    ((TestConfiguration<float,_unsigned_char> *)((long)this + 0x2c8));
  if (GVar1 == 0x8058) {
    std::__cxx11::string::operator=((string *)(outCommand.field_2._M_local_buf + 8),"vec4");
    std::__cxx11::string::operator=(local_220,"texture(test_sampler, texture_coords_out)");
  }
  else if (GVar1 == 0x8229) {
    std::__cxx11::string::operator=((string *)(outCommand.field_2._M_local_buf + 8),"float");
    std::__cxx11::string::operator=(local_220,"texture(test_sampler, texture_coords_out).x");
  }
  else if (GVar1 == 0x8235) {
    std::__cxx11::string::operator=((string *)(outCommand.field_2._M_local_buf + 8),"int");
    std::__cxx11::string::operator=(local_220,"int(texture(test_sampler, texture_coords_out).x)");
  }
  else {
    if (GVar1 != 0x8236) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Not allowed internal format!","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x349);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)(outCommand.field_2._M_local_buf + 8),"uint");
    std::__cxx11::string::operator=(local_220,"uint(texture(test_sampler, texture_coords_out).x)");
  }
  poVar3 = std::operator<<(&local_190,"${VERSION}\n\nprecision highp float;\nprecision highp ");
  poVar3 = std::operator<<(poVar3,(string *)(outType.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,";\n\nuniform ");
  poVar3 = std::operator<<(poVar3,(string *)(outType.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," test_sampler;\nin  ");
  poVar3 = std::operator<<(poVar3,(string *)(samplerType.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," texture_coords_out;\nlayout(location = 0) out ");
  poVar3 = std::operator<<(poVar3,(string *)(outCommand.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," color;\n\nvoid main()\n{\n   color = ");
  poVar3 = std::operator<<(poVar3,local_220);
  std::operator<<(poVar3,";\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)(outCommand.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(outType.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(samplerType.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)(coordType.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBorderClampSamplingTexture<InputType, OutputType>::getFragmentShaderCode(void)
{
	std::stringstream result;
	std::string		  coordType;
	std::string		  samplerType;
	std::string		  outType;
	std::string		  outCommand;

	/* Check input texture format and prepare sampler prefix */
	switch (m_test_configuration.get_input_internal_format())
	{
	case GL_RGBA32F:
	case GL_RGBA8:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT16:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
		samplerType = "";
		break;

	case GL_R32UI:
		samplerType = "u";
		break;

	case GL_R32I:
		samplerType = "i";
		break;

	default:
		throw tcu::TestError("Not allowed internal format", "", __FILE__, __LINE__);
	}

	/* Check input texture target and prepare approperiate texture coordinate type and sampler type */
	switch (m_test_configuration.get_target())
	{
	case GL_TEXTURE_2D:
		coordType = "vec2";
		samplerType += "sampler2D";
		break;

	case GL_TEXTURE_2D_ARRAY:
		coordType = "vec3";
		samplerType += "sampler2DArray";
		break;

	case GL_TEXTURE_3D:
		coordType = "vec3";
		samplerType += "sampler3D";
		break;

	default:
		throw tcu::TestError("Not allowed texture target!", "", __FILE__, __LINE__);
	}

	/* Check output texture format and prepare approperiate texel fetching method and output type */
	switch (m_test_configuration.get_output_internal_format())
	{
	case GL_RGBA8:
		outType	= "vec4";
		outCommand = "texture(test_sampler, texture_coords_out)";
		break;

	case GL_R8:
		outType	= "float";
		outCommand = "texture(test_sampler, texture_coords_out).x";
		break;

	case GL_R32UI:
		outType	= "uint";
		outCommand = "uint(texture(test_sampler, texture_coords_out).x)";
		break;

	case GL_R32I:
		outType	= "int";
		outCommand = "int(texture(test_sampler, texture_coords_out).x)";
		break;

	default:
		throw tcu::TestError("Not allowed internal format!", "", __FILE__, __LINE__);
	}

	result << "${VERSION}\n"
			  "\n"
			  "precision highp float;\n"
			  "precision highp "
		   << samplerType << ";\n"
							 "\n"
							 "uniform "
		   << samplerType << " test_sampler;\n"
							 "in  "
		   << coordType << " texture_coords_out;\n"
						   "layout(location = 0) out "
		   << outType << " color;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "   color = "
		   << outCommand << ";\n"
							"}\n";

	return result.str();
}